

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_symbol_primitive_asString
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_object_tuple_t *psVar2;
  size_t byteSize;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    byteSize = (size_t)*(uint *)(uVar1 + 0xc);
  }
  else {
    byteSize = 0;
  }
  psVar2 = sysbvm_context_allocateByteTuple(context,(context->roots).stringType,byteSize);
  if (psVar2 == (sysbvm_object_tuple_t *)0x0) {
    psVar2 = (sysbvm_object_tuple_t *)0x0;
  }
  else {
    memcpy(&psVar2->field_1,(void *)(uVar1 + 0x10),byteSize);
  }
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

sysbvm_tuple_t sysbvm_symbol_primitive_asString(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t symbol = arguments[0];
    return sysbvm_string_createWithString(context, sysbvm_tuple_getSizeInBytes(symbol), (const char*)SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(symbol)->bytes);
}